

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::CopyImage::SmokeTest::copyAndVerify(SmokeTest *this,testCase *test_case,GLubyte *src_pixels)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  TestError *this_00;
  uchar *siglen;
  uchar *tbs;
  uchar *tbslen;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_3a8;
  MessageBuilder local_398;
  GetNameFunc local_218;
  int local_210;
  Enum<int,_2UL> local_208;
  GetNameFunc local_1f8;
  int local_1f0;
  Enum<int,_2UL> local_1e8 [2];
  MessageBuilder local_1c8;
  undefined4 local_48;
  byte local_41;
  GLuint height;
  bool result;
  Functions *gl;
  GLubyte *pGStack_30;
  GLenum error;
  GLubyte *src_pixels_local;
  testCase *test_case_local;
  SmokeTest *this_local;
  
  gl._4_4_ = 0;
  pGStack_30 = src_pixels;
  src_pixels_local = (GLubyte *)test_case;
  test_case_local = (testCase *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _height = CONCAT44(extraout_var,iVar1);
  local_41 = 0;
  if (this->m_rb_name == 0) {
    local_48 = 0x10;
    if ((*(int *)src_pixels_local == 0xde0) || (*(int *)src_pixels_local == 0x8c18)) {
      local_48 = 1;
    }
    siglen = (uchar *)0x0;
    tbs = siglen;
    tbslen = siglen;
    (**(code **)(_height + 0x310))(this->m_src_tex_name,*(undefined4 *)src_pixels_local,0);
  }
  else {
    (**(code **)(_height + 0x310))
              (this->m_src_tex_name,0xde1,0,0,0,0,this->m_rb_name,*(undefined4 *)src_pixels_local,0,
               0,0,0,0x10,0x10,1);
    siglen = (uchar *)0x0;
    tbs = siglen;
    tbslen = siglen;
    (**(code **)(_height + 0x310))(this->m_rb_name,*(undefined4 *)src_pixels_local,0);
  }
  gl._4_4_ = (**(code **)(_height + 0x800))();
  if (gl._4_4_ == 0) {
    iVar1 = verify(this,(EVP_PKEY_CTX *)src_pixels_local,pGStack_30,(size_t)siglen,tbs,
                   (size_t)tbslen);
    local_41 = (byte)iVar1 & 1;
  }
  if ((gl._4_4_ == 0) && ((local_41 & 1) != 0)) {
    this_local._7_1_ = true;
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_1c8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [18])"Failure. Target: ");
    EVar6 = glu::getTextureTargetStr(*(int *)src_pixels_local);
    local_1f8 = EVar6.m_getName;
    local_1f0 = EVar6.m_value;
    local_1e8[0].m_getName = local_1f8;
    local_1e8[0].m_value = local_1f0;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1e8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])". Format: ");
    EVar6 = glu::getInternalFormatParameterStr(*(int *)(src_pixels_local + 4));
    local_218 = EVar6.m_getName;
    local_210 = EVar6.m_value;
    local_208.m_getName = local_218;
    local_208.m_value = local_210;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_208);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    if (gl._4_4_ != 0) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_398,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_398,(char (*) [22])"Failed due to error: ");
      EVar6 = glu::getErrorStr(gl._4_4_);
      local_3a8.m_getName = EVar6.m_getName;
      local_3a8.m_value = EVar6.m_value;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3a8);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_398);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Copy operation failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0xf83);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SmokeTest::copyAndVerify(const testCase& test_case, const GLubyte* src_pixels)
{
	GLenum			 error  = GL_NO_ERROR;
	const Functions& gl		= m_context.getRenderContext().getFunctions();
	bool			 result = false;

	/* Copy and verification */
	{
		if (0 == m_rb_name)
		{
			GLuint height = m_height;

			if ((GL_TEXTURE_1D == test_case.m_target) || (GL_TEXTURE_1D_ARRAY == test_case.m_target))
			{
				height = 1;
			}

			gl.copyImageSubData(m_src_tex_name, test_case.m_target, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
								0 /* srcZ */, m_dst_tex_name, test_case.m_target, 0 /* dstLevel */, 0 /* dstX */,
								0 /* dstY */, 0 /* dstZ */, m_width, height, m_depth);
		}
		else /* Copy from src to rb and from rb to dst */
		{
			/* Src and rb shares differs only on target */
			gl.copyImageSubData(m_src_tex_name, GL_TEXTURE_2D, 0 /* srcLevel */, 0 /* srcX */, 0 /* srcY */,
								0 /* srcZ */, m_rb_name, test_case.m_target, 0 /* dstLevel */, 0 /* dstX */,
								0 /* dstY */, 0 /* dstZ */, m_width, m_height, m_depth);

			gl.copyImageSubData(m_rb_name, test_case.m_target, 0 /* dstLevel */, 0 /* dstX */, 0 /* dstY */,
								0 /* dstZ */, m_dst_tex_name, GL_TEXTURE_2D, 0 /* dstLevel */, 0 /* dstX */,
								0 /* dstY */, 0 /* dstZ */, m_width, m_height, m_depth);
		}

		/* Verify generated error */
		error = gl.getError();

		if (GL_NO_ERROR == error)
		{
			/* Verify copy results */
			result = verify(test_case, src_pixels);
		}

		if ((GL_NO_ERROR != error) || (false == result))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure. Target: " << glu::getTextureTargetStr(test_case.m_target)
				<< ". Format: " << glu::getInternalFormatParameterStr(test_case.m_internal_format)
				<< tcu::TestLog::EndMessage;

			if (GL_NO_ERROR != error)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "Failed due to error: " << glu::getErrorStr(error)
													<< tcu::TestLog::EndMessage;

				TCU_FAIL("Copy operation failed");
			}

			return false;
		}
	}

	return true;
}